

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

StackSym * __thiscall GlobOpt::GetTaggedIntConstantStackSym(GlobOpt *this,int32 intConstantValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym **ppSVar4;
  StackSym *local_28;
  long local_20;
  int32 local_14;
  GlobOpt *pGStack_10;
  int32 intConstantValue_local;
  GlobOpt *this_local;
  
  local_14 = intConstantValue;
  pGStack_10 = this;
  bVar2 = Js::TaggedInt::IsOverflow(intConstantValue);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1215,"(!Js::TaggedInt::IsOverflow(intConstantValue))",
                       "!Js::TaggedInt::IsOverflow(intConstantValue)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_20 = (long)local_14;
  local_28 = (StackSym *)0x0;
  ppSVar4 = JsUtil::
            BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Lookup(this->intConstantToStackSymMap,&local_20,&local_28);
  return *ppSVar4;
}

Assistant:

StackSym *GlobOpt::GetTaggedIntConstantStackSym(const int32 intConstantValue) const
{
    Assert(!Js::TaggedInt::IsOverflow(intConstantValue));

    return intConstantToStackSymMap->Lookup(intConstantValue, nullptr);
}